

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  basic_string_view<char> sep;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> out;
  add_thousands_sep<char> sep_00;
  undefined8 *in_RSI;
  long in_RDI;
  basic_string_view<char> s;
  add_thousands_sep<char> local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uVar1;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  char *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&stack0xffffffffffffffe0,(char *)(in_RDI + 8),1);
  local_60 = *in_RSI;
  local_58 = in_RSI[1];
  uVar1 = in_RSI[2];
  sep.size_ = in_stack_ffffffffffffffe8;
  sep.data_ = in_stack_ffffffffffffffe0;
  internal::add_thousands_sep<char>::add_thousands_sep(&local_78,sep);
  out.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffffc8;
  out.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffffc0;
  out.super_truncating_iterator_base<char_*>.count_ = in_stack_ffffffffffffffd0;
  out.blackhole_ = in_stack_ffffffffffffffd8;
  out._25_7_ = in_stack_ffffffffffffffd9;
  sep_00.sep_.size_ = in_stack_ffffffffffffffe8;
  sep_00.sep_.data_ = in_stack_ffffffffffffffe0;
  sep_00._16_8_ = in_RSI;
  internal::
  format_decimal<char,unsigned_int,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,fmt::v5::internal::add_thousands_sep<char>>
            (out,(uint)((ulong)uVar1 >> 0x20),(int)uVar1,sep_00);
  *in_RSI = in_stack_ffffffffffffffc0;
  in_RSI[1] = in_stack_ffffffffffffffc8;
  in_RSI[2] = in_stack_ffffffffffffffd0;
  *(undefined1 *)(in_RSI + 3) = in_stack_ffffffffffffffd8;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }